

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall
FascodeUtil::msg::print(msg *this,MSG_TYPE msgtype,string *appname,int numberspace,string *message)

{
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)appname);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60," ",&local_81);
  std::__cxx11::string::string((string *)&local_80,(string *)message);
  print(this,msgtype,&local_40,&local_60,numberspace,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,int numberspace,std::string message){
        print(msgtype,appname," ",numberspace,message);
    }